

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_scrollbar_behavior
                (nk_flags *state,nk_input *in,int has_scrolling,nk_rect *scroll,nk_rect *cursor,
                nk_rect *empty0,nk_rect *empty1,float scroll_offset,float target,float scroll_step,
                nk_orientation o)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_rect *pnVar2;
  uint uVar5;
  nk_rect *pnVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  nk_rect rect;
  float local_c0;
  nk_flags ws;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  nk_rect *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ws = 0;
  uVar10 = *state & 2 | 4;
  *state = uVar10;
  if (in == (nk_input *)0x0) {
    return scroll_offset;
  }
  iVar9 = (in->mouse).buttons[0].down;
  local_48._0_4_ = cursor->w;
  local_48._4_4_ = cursor->h;
  uStack_40 = 0;
  local_7c = scroll_step;
  local_60 = empty0;
  iVar7 = nk_input_has_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,*cursor,1);
  local_58._0_4_ = scroll->x;
  local_58._4_4_ = scroll->y;
  uVar3 = scroll->h;
  uStack_50 = 0;
  local_98 = scroll;
  local_78 = (float)uVar3;
  fStack_74 = (float)uVar3;
  fStack_70 = (float)uVar3;
  fStack_6c = (float)uVar3;
  iVar8 = nk_input_is_mouse_hovering_rect(in,*scroll);
  pnVar6 = local_98;
  if (iVar8 != 0) {
    *state = 0x12;
    uVar10 = 0x12;
  }
  if ((iVar9 != 0) && (iVar7 != 0)) {
    *state = 0x22;
    if (o == NK_VERTICAL) {
      fVar13 = ((in->mouse).delta.y / local_78) * target + scroll_offset;
      if (target - local_78 <= fVar13) {
        fVar13 = target - local_78;
      }
      local_c0 = 0.0;
      if (0.0 <= fVar13) {
        local_c0 = fVar13;
      }
      (in->mouse).buttons[0].clicked_pos.y =
           local_48._4_4_ * 0.5 + (local_c0 / target) * local_78 + local_58._4_4_;
      uVar10 = 0x22;
    }
    else {
      fVar13 = local_98->w;
      fVar12 = ((in->mouse).delta.x / fVar13) * target + scroll_offset;
      if (target - fVar13 <= fVar12) {
        fVar12 = target - fVar13;
      }
      local_c0 = 0.0;
      if (0.0 <= fVar12) {
        local_c0 = fVar12;
      }
      (in->mouse).buttons[0].clicked_pos.x =
           cursor->w * 0.5 + (local_c0 / target) * fVar13 + local_98->x;
      uVar10 = 0x22;
    }
    goto LAB_0013f43e;
  }
  uVar5 = (in->keyboard).keys[0x1d].clicked;
  if ((in->keyboard).keys[0x1d].down == 0) {
    if (1 < uVar5) goto LAB_0013f347;
LAB_0013f370:
    local_98 = (nk_rect *)
               CONCAT44(local_98._4_4_,
                        (&((nk_vec2 *)((in->mouse).buttons + 5))[1].x)[o == NK_VERTICAL]);
    iVar9 = nk_button_behavior(&ws,*local_60,in,NK_BUTTON_DEFAULT);
    if (iVar9 != 0) {
      fVar13 = local_78;
      if (o != NK_VERTICAL) {
        fVar13 = pnVar6->w;
      }
      goto LAB_0013f3b4;
    }
    uVar5 = (in->keyboard).keys[0x1c].clicked;
    if ((in->keyboard).keys[0x1c].down == 0) {
      bVar11 = 1 < uVar5;
    }
    else {
      bVar11 = uVar5 != 0;
    }
    if ((bool)(bVar11 & o == NK_VERTICAL & has_scrolling != 0)) {
LAB_0013f4e2:
      local_c0 = scroll_offset + local_78;
      if (target - local_78 <= scroll_offset + local_78) {
        local_c0 = target - local_78;
      }
    }
    else {
      iVar9 = nk_button_behavior(&ws,*empty1,in,NK_BUTTON_DEFAULT);
      if (iVar9 == 0) {
        local_c0 = scroll_offset;
        if (has_scrolling != 0) {
          if ((float)local_98 == 0.0) {
            uVar5 = (in->keyboard).keys[0x1a].clicked;
            if ((in->keyboard).keys[0x1a].down == 0) {
              if (1 < uVar5) goto LAB_0013f5b3;
            }
            else if (uVar5 != 0) {
LAB_0013f5b3:
              local_c0 = scroll_offset;
              if (o == NK_VERTICAL) {
                fVar13 = 0.0;
                goto LAB_0013f620;
              }
              goto LAB_0013f43e;
            }
            uVar5 = (in->keyboard).keys[0x1b].clicked;
            if ((in->keyboard).keys[0x1b].down == 0) {
              local_c0 = scroll_offset;
              if (1 < uVar5 && o == NK_VERTICAL) goto LAB_0013f61a;
            }
            else {
              local_c0 = scroll_offset;
              if (o == NK_VERTICAL && uVar5 != 0) {
LAB_0013f61a:
                fVar13 = target - local_78;
                goto LAB_0013f620;
              }
            }
          }
          else {
            local_c0 = scroll_offset - local_7c * (float)local_98;
            fVar13 = local_78;
            if (o != NK_VERTICAL) {
              fVar13 = pnVar6->w;
            }
            if (target - fVar13 <= local_c0) {
              local_c0 = target - fVar13;
            }
            fVar13 = 0.0;
            if (local_c0 < 0.0) {
LAB_0013f620:
              local_c0 = fVar13;
            }
          }
        }
      }
      else {
        if (o == NK_VERTICAL) goto LAB_0013f4e2;
        local_c0 = scroll_offset + pnVar6->w;
        fVar13 = target - pnVar6->w;
        if (fVar13 <= local_c0) {
          local_c0 = fVar13;
        }
      }
    }
  }
  else {
    if (uVar5 == 0) goto LAB_0013f370;
LAB_0013f347:
    fVar13 = local_78;
    if (has_scrolling == 0 || o != NK_VERTICAL) goto LAB_0013f370;
LAB_0013f3b4:
    local_c0 = scroll_offset - fVar13;
    if (scroll_offset - fVar13 <= 0.0) {
      local_c0 = 0.0;
    }
  }
LAB_0013f43e:
  uVar1 = pnVar6->x;
  uVar4 = pnVar6->y;
  rect.y = (float)uVar4;
  rect.x = (float)uVar1;
  pnVar2 = *(nk_rect **)&pnVar6->w;
  uVar14 = (int)pnVar2;
  uVar15 = (int)((ulong)pnVar2 >> 0x20);
  if ((uVar10 & 0x10) != 0) {
    uStack_90 = 0;
    local_98 = pnVar2;
    iVar9 = nk_input_is_mouse_prev_hovering_rect(in,*pnVar6);
    uVar14 = (float)local_98;
    uVar15 = local_98._4_4_;
    if (iVar9 == 0) {
      uVar5 = 8;
      goto LAB_0013f495;
    }
  }
  rect.h = (float)uVar15;
  rect.w = (float)uVar14;
  iVar9 = nk_input_is_mouse_prev_hovering_rect(in,rect);
  if (iVar9 == 0) {
    return local_c0;
  }
  uVar5 = 0x40;
LAB_0013f495:
  *state = uVar10 | uVar5;
  return local_c0;
}

Assistant:

NK_LIB float
nk_scrollbar_behavior(nk_flags *state, struct nk_input *in,
    int has_scrolling, const struct nk_rect *scroll,
    const struct nk_rect *cursor, const struct nk_rect *empty0,
    const struct nk_rect *empty1, float scroll_offset,
    float target, float scroll_step, enum nk_orientation o)
{
    nk_flags ws = 0;
    int left_mouse_down;
    int left_mouse_click_in_cursor;
    float scroll_delta;

    nk_widget_state_reset(state);
    if (!in) return scroll_offset;

    left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
        NK_BUTTON_LEFT, *cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, *scroll))
        *state = NK_WIDGET_STATE_HOVERED;

    scroll_delta = (o == NK_VERTICAL) ? in->mouse.scroll_delta.y: in->mouse.scroll_delta.x;
    if (left_mouse_down && left_mouse_click_in_cursor) {
        /* update cursor by mouse dragging */
        float pixel, delta;
        *state = NK_WIDGET_STATE_ACTIVE;
        if (o == NK_VERTICAL) {
            float cursor_y;
            pixel = in->mouse.delta.y;
            delta = (pixel / scroll->h) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->h);
            cursor_y = scroll->y + ((scroll_offset/target) * scroll->h);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = cursor_y + cursor->h/2.0f;
        } else {
            float cursor_x;
            pixel = in->mouse.delta.x;
            delta = (pixel / scroll->w) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->w);
            cursor_x = scroll->x + ((scroll_offset/target) * scroll->w);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor_x + cursor->w/2.0f;
        }
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_UP) && o == NK_VERTICAL && has_scrolling)||
            nk_button_behavior(&ws, *empty0, in, NK_BUTTON_DEFAULT)) {
        /* scroll page up by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MAX(0, scroll_offset - scroll->h);
        else scroll_offset = NK_MAX(0, scroll_offset - scroll->w);
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_DOWN) && o == NK_VERTICAL && has_scrolling) ||
        nk_button_behavior(&ws, *empty1, in, NK_BUTTON_DEFAULT)) {
        /* scroll page down by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MIN(scroll_offset + scroll->h, target - scroll->h);
        else scroll_offset = NK_MIN(scroll_offset + scroll->w, target - scroll->w);
    } else if (has_scrolling) {
        if ((scroll_delta < 0 || (scroll_delta > 0))) {
            /* update cursor by mouse scrolling */
            scroll_offset = scroll_offset + scroll_step * (-scroll_delta);
            if (o == NK_VERTICAL)
                scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->h);
            else scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->w);
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_START)) {
            /* update cursor to the beginning  */
            if (o == NK_VERTICAL) scroll_offset = 0;
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_END)) {
            /* update cursor to the end */
            if (o == NK_VERTICAL) scroll_offset = target - scroll->h;
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_LEFT;
    return scroll_offset;
}